

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  Descriptor *pDVar1;
  char *pcVar2;
  int __c;
  int *__args;
  int local_1c;
  
  if (((byte)this[1] & 8) == 0) {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x20),output);
    local_1c = 2;
  }
  else {
    pDVar1 = extension_scope(this);
    if (pDVar1 == (Descriptor *)0x0) {
      local_1c = 7;
    }
    else {
      pDVar1 = extension_scope(this);
      Descriptor::GetLocationPath(pDVar1,output);
      local_1c = 6;
    }
  }
  __args = &local_1c;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,__args);
  pcVar2 = index(this,(char *)__args,__c);
  local_1c = (int)pcVar2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == nullptr) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}